

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O1

uint32_t event_track::get_meta_header_bytes
                   (uint32_t track_id,uint32_t timescale,
                   vector<unsigned_char,_std::allocator<unsigned_char>_> *header_bytes,bool is_vtt)

{
  pointer *ppuVar1;
  int iVar2;
  int iVar3;
  pointer puVar4;
  iterator __position;
  size_type __n;
  size_type sVar5;
  undefined3 in_register_00000009;
  stringstream ot;
  uchar local_1b1;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0,_S_out|_S_in|_S_bin);
  if (CONCAT31(in_register_00000009,is_vtt) == 0) {
    write_event_track_cmaf_header(track_id,timescale,local_1a0);
  }
  else {
    write_vtt_track_cmaf_header(track_id,timescale,local_1a0);
  }
  std::istream::seekg((long)local_1b0,_S_beg);
  __n = std::istream::tellg();
  std::istream::seekg((long)local_1b0,_S_beg);
  puVar4 = (header_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if ((header_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (header_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(header_bytes,__n);
  while( true ) {
    sVar5 = std::istream::tellg();
    if (sVar5 == __n) break;
    local_1b1 = std::istream::get();
    __position._M_current =
         (header_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (header_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (header_bytes,__position,&local_1b1);
    }
    else {
      *__position._M_current = local_1b1;
      ppuVar1 = &(header_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  iVar2 = *(int *)&(header_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = *(int *)&(header_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return iVar2 - iVar3;
}

Assistant:

uint32_t event_track::get_meta_header_bytes(
	uint32_t track_id,
	uint32_t timescale,
	std::vector<uint8_t>& header_bytes,
	bool is_vtt)
{
	std::stringstream ot(
		std::stringstream::out | \
		std::stringstream::in | \
		std::stringstream::binary\
	);
	if (is_vtt)
		event_track::write_vtt_track_cmaf_header(track_id, timescale, ot);
	else
	    event_track::write_event_track_cmaf_header(track_id, timescale, ot);

	ot.seekg(0, ot.end);
	uint64_t length = ot.tellg();
	ot.seekg(0, ot.beg);
	header_bytes.clear();
	header_bytes.reserve(length);

	char c;
	while (ot.tellg() != length)
	{
		c = ot.get();
		header_bytes.push_back((uint8_t)c);
	}

	return (uint32_t)header_bytes.size();
}